

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O2

void Sbm_AddCardinConstrRange(sat_solver *p,int *pVars,int lo,int hi,int *pnVars)

{
  int i;
  int hi_00;
  uint uVar1;
  
  uVar1 = hi - lo;
  if (uVar1 != 0 && lo <= hi) {
    hi_00 = (uVar1 >> 1) + lo;
    for (i = lo; i <= hi_00; i = i + 1) {
      Sbm_AddSorter(p,pVars,i,(uVar1 + 1 >> 1) + i,pnVars);
    }
    Sbm_AddCardinConstrRange(p,pVars,lo,hi_00,pnVars);
    Sbm_AddCardinConstrRange(p,pVars,hi_00 + 1,hi,pnVars);
    Sbm_AddCardinConstrMerge(p,pVars,lo,hi,1,pnVars);
    return;
  }
  return;
}

Assistant:

static inline void Sbm_AddCardinConstrRange( sat_solver * p, int * pVars, int lo, int hi, int * pnVars )
{
    if ( hi - lo >= 1 )
    {
        int i, mid = lo + (hi - lo) / 2;
        for ( i = lo; i <= mid; i++ )
            Sbm_AddSorter( p, pVars, i, i + (hi - lo + 1) / 2, pnVars );
        Sbm_AddCardinConstrRange( p, pVars, lo, mid, pnVars );
        Sbm_AddCardinConstrRange( p, pVars, mid+1, hi, pnVars );
        Sbm_AddCardinConstrMerge( p, pVars, lo, hi, 1, pnVars );
    }
}